

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

bool __thiscall MlmWrap::blockforreply(MlmWrap *this,string *tracker,uint32_t timeoutms)

{
  void *self;
  int iVar1;
  undefined8 uVar2;
  MlmWrap *this_00;
  string *s;
  ostream *poVar3;
  uint in_EDX;
  string *in_RSI;
  long in_RDI;
  bool success;
  char *status;
  zmsg_t *msg;
  lock_guard<std::mutex> lock;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  lock_guard<std::mutex> *in_stack_ffffffffffffff30;
  allocator local_89;
  string local_88 [32];
  string local_68 [39];
  byte local_41;
  
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff30,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  self = *(void **)(in_RDI + 0x40);
  uVar2 = std::__cxx11::string::c_str();
  zsock_send(self,"ss4","BUR",uVar2,(ulong)in_EDX);
  this_00 = (MlmWrap *)zactor_recv(*(zactor_t **)(in_RDI + 0x40));
  s = (string *)zmsg_popstr((zmsg_t *)this_00);
  local_41 = 0;
  iVar1 = strcmp((char *)s,"BURs");
  if (iVar1 == 0) {
    local_41 = 1;
  }
  else {
    iVar1 = strcmp((char *)s,"BURf");
    if (iVar1 == 0) {
      local_41 = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_88,"Error with blockforreply() when waiting for ",&local_89);
      error(this_00,s);
      poVar3 = std::operator<<((ostream *)&std::cerr,local_68);
      poVar3 = std::operator<<(poVar3,in_RSI);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x368a0b);
  return (bool)(local_41 & 1);
}

Assistant:

bool MlmWrap::blockforreply(std::string tracker, uint32_t timeoutms){
    std::lock_guard<std::mutex> lock(actormutex);
    zsock_send(actor, "ss4", blockuntilrep, tracker.c_str(), timeoutms);
    zmsg_t *msg = zactor_recv(actor);
    char *status = zmsg_popstr(msg);
    bool success = false;
    if(streq(status, blockrepsuccess)){
        success = true;
    }
    else if(streq(status, blockrepfailure)){
        success = false;
    }
    else{
        std::cerr << error("Error with blockforreply() when waiting for ") << tracker << "\n";
    }
    return success;
}